

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O3

double TestSpectra::PowLawFit_spectrum(double xMin,double xMax,double expo)

{
  RandomGen *this;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __y;
  
  __y = expo + 1.0;
  dVar1 = (double)(~-(ulong)(0.0 < xMin) & 0x3fb999999999999a | -(ulong)(0.0 < xMin) & (ulong)xMin);
  dVar2 = xMax;
  dVar4 = dVar1;
  if (0.0 <= __y) {
    dVar2 = xMin;
    dVar4 = xMin;
  }
  dVar1 = pow((double)(~-(ulong)(__y < 0.0) & (ulong)xMax | -(ulong)(__y < 0.0) & (ulong)dVar1),__y)
  ;
  dVar2 = pow(dVar2,__y);
  this = RandomGen::rndm();
  dVar3 = RandomGen::rand_uniform(this);
  dVar2 = pow(dVar3 * (dVar1 - dVar2) + dVar2,1.0 / __y);
  if (dVar4 <= dVar2) {
    dVar4 = dVar2;
  }
  if (dVar4 <= xMax) {
    xMax = dVar4;
  }
  return xMax;
}

Assistant:

double TestSpectra::PowLawFit_spectrum( //OK for LZ AmBe (Yongheng)
		    double xMin, double xMax, double expo) {
  double yMax, yMin; ++expo;
  if ( expo < 0. ) {
    if ( xMin <= 0. ) xMin = 0.1; //100 eV
    yMax = pow(xMin,expo);
    yMin = pow(xMax,expo);
  }
  else {
    yMax = pow(xMax,expo);
    yMin = pow(xMin,expo);
  }
  double xTry = pow(yMin+(yMax-yMin)*RandomGen::rndm()->rand_uniform(),1./expo);
  if ( xTry < xMin ) xTry = xMin;
  if ( xTry > xMax ) xTry = xMax; //these can create pileup
  return xTry;
}